

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppillr.cpp
# Opt level: O0

bool parse_options(int argc,char **argv,Options *options)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  istream *piVar6;
  long lVar7;
  value_type local_2a8;
  undefined1 local_288 [8];
  string line;
  ifstream f;
  allocator local_49;
  value_type local_48;
  int local_24;
  Options *pOStack_20;
  int i;
  Options *options_local;
  char **argv_local;
  int argc_local;
  
  local_24 = 1;
  pOStack_20 = options;
  options_local = (Options *)argv;
  argv_local._0_4_ = argc;
  do {
    if ((int)argv_local <= local_24) {
      return true;
    }
    if (**(char **)(&(options_local->command)._M_dataplus + (long)local_24 * 8) == '-') {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) != 0) {
        std::__cxx11::string::operator=((string *)pOStack_20,"none");
      }
      iVar3 = strcmp(*(char **)(&(options_local->command)._M_dataplus + (long)local_24 * 8),"-h");
      if (iVar3 == 0) {
        printf("%s [-h] [directory | files.cpp]",*(undefined8 *)&options_local->command);
        return false;
      }
      iVar3 = strcmp(*(char **)(&(options_local->command)._M_dataplus + (long)local_24 * 8),
                     "-filelist");
      if (iVar3 == 0) {
        local_24 = local_24 + 1;
        if (local_24 < (int)argv_local) {
          std::ifstream::ifstream
                    ((undefined1 *)((long)&line.field_2 + 8),
                     *(undefined8 *)(&(options_local->command)._M_dataplus + (long)local_24 * 8),8);
          std::__cxx11::string::string((string *)local_288);
          while( true ) {
            piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)(line.field_2._M_local_buf + 8),(string *)local_288);
            bVar2 = std::ios::operator_cast_to_bool
                              ((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
            if (!bVar2) break;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&pOStack_20->parse_files,(value_type *)local_288);
          }
          std::__cxx11::string::~string((string *)local_288);
          std::ifstream::~ifstream((void *)((long)&line.field_2 + 8));
        }
      }
      else {
        iVar3 = strcmp(*(char **)(&(options_local->command)._M_dataplus + (long)local_24 * 8),
                       "-print");
        if (iVar3 == 0) {
          local_24 = local_24 + 1;
          if (local_24 < (int)argv_local) {
            std::__cxx11::string::operator=
                      ((string *)&pOStack_20->print,
                       *(char **)(&(options_local->command)._M_dataplus + (long)local_24 * 8));
          }
        }
        else {
          iVar3 = strcmp(*(char **)(&(options_local->command)._M_dataplus + (long)local_24 * 8),
                         "-showtime");
          if (iVar3 == 0) {
            pOStack_20->show_time = true;
          }
          else {
            iVar3 = strcmp(*(char **)(&(options_local->command)._M_dataplus + (long)local_24 * 8),
                           "-showtokens");
            if (iVar3 == 0) {
              pOStack_20->show_tokens = true;
            }
            else {
              iVar3 = strcmp(*(char **)(&(options_local->command)._M_dataplus + (long)local_24 * 8),
                             "-showast");
              if (iVar3 == 0) {
                pOStack_20->show_ast = true;
              }
              else {
                iVar3 = strcmp(*(char **)(&(options_local->command)._M_dataplus + (long)local_24 * 8
                                         ),"-showincludes");
                if (iVar3 == 0) {
                  pOStack_20->show_includes = true;
                }
                else {
                  iVar3 = strcmp(*(char **)(&(options_local->command)._M_dataplus +
                                           (long)local_24 * 8),"-showfunctions");
                  if (iVar3 == 0) {
                    pOStack_20->show_functions = true;
                  }
                  else {
                    iVar3 = strcmp(*(char **)(&(options_local->command)._M_dataplus +
                                             (long)local_24 * 8),"-counttokens");
                    if (iVar3 == 0) {
                      pOStack_20->count_tokens = true;
                    }
                    else {
                      iVar3 = strcmp(*(char **)(&(options_local->command)._M_dataplus +
                                               (long)local_24 * 8),"-countlines");
                      if (iVar3 == 0) {
                        pOStack_20->count_lines = true;
                      }
                      else {
                        iVar3 = strcmp(*(char **)(&(options_local->command)._M_dataplus +
                                                 (long)local_24 * 8),"-keywordstats");
                        if (iVar3 == 0) {
                          pOStack_20->keyword_stats = true;
                        }
                        else {
                          iVar3 = strcmp(*(char **)(&(options_local->command)._M_dataplus +
                                                   (long)local_24 * 8),"-threads");
                          if (iVar3 == 0) {
                            local_24 = local_24 + 1;
                            if (local_24 < (int)argv_local) {
                              lVar7 = strtol(*(char **)(&(options_local->command)._M_dataplus +
                                                       (long)local_24 * 8),(char **)0x0,10);
                              pOStack_20->threads = (int)lVar7;
                            }
                          }
                          else {
                            iVar3 = strcmp(*(char **)(&(options_local->command)._M_dataplus +
                                                     (long)local_24 * 8),"--");
                            if (iVar3 != 0) {
                              printf("%s: invalid argument %s\n",
                                     *(undefined8 *)&options_local->command,
                                     *(undefined8 *)
                                      (&(options_local->command)._M_dataplus + (long)local_24 * 8));
                              return false;
                            }
                            local_24 = local_24 + 1;
                            pvVar5 = &pOStack_20->parse_files;
                            std::__cxx11::string::string((string *)&local_2a8);
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::push_back(pvVar5,&local_2a8);
                            std::__cxx11::string::~string((string *)&local_2a8);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        pvVar5 = &pOStack_20->parse_files;
        pcVar1 = *(char **)(&(options_local->command)._M_dataplus + (long)local_24 * 8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_48,pcVar1,&local_49);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pvVar5,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::allocator<char>::~allocator((allocator<char> *)&local_49);
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)pOStack_20,
                   *(char **)(&(options_local->command)._M_dataplus + (long)local_24 * 8));
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

bool parse_options(int argc, char* argv[], Options& options)
{
  for (int i=1; i<argc; ++i) {
    // Ignore empty args?
    if (argv[i][0] != '-') {
      if (options.command.empty())
        options.command = argv[i];
      else
        options.parse_files.push_back(argv[i]);
      continue;
    }
    else if (options.command.empty()) {
      options.command = "none";
    }

    if (std::strcmp(argv[i], "-h") == 0) {
      std::printf("%s [-h] [directory | files.cpp]",
                  argv[0]);
      return false;
    }
    else if (std::strcmp(argv[i], "-filelist") == 0) {
      ++i;
      if (i < argc) {
        std::ifstream f(argv[i]);
        std::string line;
        while (std::getline(f, line)) {
          options.parse_files.push_back(line);
        }
      }
    }
    else if (std::strcmp(argv[i], "-print") == 0) {
      ++i;
      if (i < argc) {
        options.print = argv[i];
      }
    }
    else if (std::strcmp(argv[i], "-showtime") == 0) {
      options.show_time = true;
    }
    else if (std::strcmp(argv[i], "-showtokens") == 0) {
      options.show_tokens = true;
    }
    else if (std::strcmp(argv[i], "-showast") == 0) {
      options.show_ast = true;
    }
    else if (std::strcmp(argv[i], "-showincludes") == 0) {
      options.show_includes = true;
    }
    else if (std::strcmp(argv[i], "-showfunctions") == 0) {
      options.show_functions = true;
    }
    else if (std::strcmp(argv[i], "-counttokens") == 0) {
      options.count_tokens = true;
    }
    else if (std::strcmp(argv[i], "-countlines") == 0) {
      options.count_lines = true;
    }
    else if (std::strcmp(argv[i], "-keywordstats") == 0) {
      options.keyword_stats = true;
    }
    else if (std::strcmp(argv[i], "-threads") == 0) {
      ++i;
      if (i < argc) {
        options.threads = std::strtol(argv[i], nullptr, 10);
      }
    }
    else if (std::strcmp(argv[i], "--") == 0) {
      ++i;
      options.parse_files.push_back(std::string()); // parse stdin
    }
    else {
      std::printf("%s: invalid argument %s\n", argv[0], argv[i]);
      return false;
    }
  }
  return true;
}